

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O2

void __thiscall deci::stack_t::Print(stack_t *this,ostream *output)

{
  pointer ppvVar1;
  pointer ppvVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  value_t *pvVar6;
  size_t i;
  size_t depth;
  string local_50 [32];
  
  ppvVar1 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppvVar2 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  poVar5 = std::operator<<(output,"result: ");
  (*this->result->_vptr_value_t[4])(local_50);
  poVar5 = std::operator<<(poVar5,local_50);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string(local_50);
  for (depth = 0; (long)ppvVar1 - (long)ppvVar2 >> 3 != depth; depth = depth + 1) {
    pvVar6 = Top(this,depth);
    lVar3 = *(long *)output;
    lVar4 = *(long *)(lVar3 + -0x18);
    *(uint *)(output + lVar4 + 0x18) = *(uint *)(output + lVar4 + 0x18) & 0xffffff4f | 0x80;
    lVar3 = *(long *)(lVar3 + -0x18);
    *(uint *)(output + lVar3 + 0x18) = *(uint *)(output + lVar3 + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::operator<<(output,0x30);
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 4;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,": ");
    (*pvVar6->_vptr_value_t[4])(local_50,pvVar6);
    poVar5 = std::operator<<(poVar5,local_50);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void stack_t::Print(std::ostream& output) {
    size_t depth = this->Depth();

    output << "result: " << this->result->ToText() << std::endl;

    for (size_t i = 0; i < depth; ++i) {
      value_t& elem = this->Top(i);
      output << std::right << std::hex << std::setfill('0')
        << std::setw(4) << i << ": "
        << elem.ToText() << std::endl;
    }
  }